

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O0

Gia_Man_t *
Bmc_GiaGenerateGiaAllOne(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Bit_t *pVVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  Gia_Man_t *pGVar9;
  bool bVar10;
  int fCompl1;
  int fCompl0;
  int iBit;
  int k;
  int i;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int iFrEnd_local;
  int iFrBeg_local;
  Vec_Bit_t **pvInits_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  fCompl1 = 0;
  Gia_ManCleanMark0(p);
  fCompl0 = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p);
    bVar10 = false;
    if (fCompl0 < iVar3) {
      iVar3 = Gia_ManPiNum(p);
      pObjRo = Gia_ManCi(p,iVar3 + fCompl0);
      bVar10 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),fCompl1);
    *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
    fCompl0 = fCompl0 + 1;
    fCompl1 = fCompl1 + 1;
  }
  iVar3 = Gia_ManRegNum(p);
  pVVar6 = Vec_BitStart(iVar3);
  *pvInits = pVVar6;
  for (iBit = 0; iBit < iFrEnd; iBit = iBit + 1) {
    if (iBit == iFrBeg) {
      fCompl0 = 0;
      while( true ) {
        iVar3 = Gia_ManRegNum(p);
        bVar10 = false;
        if (fCompl0 < iVar3) {
          iVar3 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar3 + fCompl0);
          bVar10 = pObjRi != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        if ((*(ulong *)pObjRi >> 0x1e & 1) != 0) {
          Vec_BitWriteEntry(*pvInits,fCompl0,1);
        }
        fCompl0 = fCompl0 + 1;
      }
    }
    fCompl0 = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(p);
      bVar10 = false;
      if (fCompl0 < iVar3) {
        pObjRo = Gia_ManCi(p,fCompl0);
        bVar10 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),fCompl1);
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      fCompl0 = fCompl0 + 1;
      fCompl1 = fCompl1 + 1;
    }
    fCompl0 = 0;
    while( true ) {
      bVar10 = false;
      if (fCompl0 < p->nObjs) {
        pObjRo = Gia_ManObj(p,fCompl0);
        bVar10 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar3 = Gia_ObjIsAnd(pObjRo);
      if (iVar3 != 0) {
        pGVar7 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(ulong *)pGVar7;
        uVar5 = Gia_ObjFaninC0(pObjRo);
        pGVar7 = Gia_ObjFanin1(pObjRo);
        uVar1 = *(ulong *)pGVar7;
        uVar4 = Gia_ObjFaninC1(pObjRo);
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xffffffffbfffffff |
             ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) & 1
             ) << 0x1e;
      }
      fCompl0 = fCompl0 + 1;
    }
    fCompl0 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar10 = false;
      if (fCompl0 < iVar3) {
        pObjRo = Gia_ManCo(p,fCompl0);
        bVar10 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      pGVar7 = Gia_ObjFanin0(pObjRo);
      uVar2 = *(ulong *)pGVar7;
      uVar5 = Gia_ObjFaninC0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      fCompl0 = fCompl0 + 1;
    }
    fCompl0 = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(p);
      bVar10 = false;
      if (fCompl0 < iVar3) {
        iVar3 = Gia_ManPoNum(p);
        _k = Gia_ManCo(p,iVar3 + fCompl0);
        bVar10 = false;
        if (_k != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar3 + fCompl0);
          bVar10 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar10) break;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff | (ulong)((uint)(*(ulong *)_k >> 0x1e) & 1) << 0x1e
      ;
      fCompl0 = fCompl0 + 1;
    }
  }
  if (iBit != iFrEnd) {
    __assert_fail("i == iFrEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                  ,0x18a,
                  "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                 );
  }
  p_00 = Gia_ManStart(10000);
  pcVar8 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar8;
  pGVar7 = Gia_ManConst0(p);
  pGVar7->Value = 1;
  fCompl0 = 0;
  while( true ) {
    iVar3 = Gia_ManPiNum(p);
    bVar10 = false;
    if (fCompl0 < iVar3) {
      pObjRo = Gia_ManCi(p,fCompl0);
      bVar10 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    pObjRo->Value = 1;
    fCompl0 = fCompl0 + 1;
  }
  fCompl0 = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p);
    bVar10 = false;
    if (fCompl0 < iVar3) {
      iVar3 = Gia_ManPiNum(p);
      pObjRi = Gia_ManCi(p,iVar3 + fCompl0);
      bVar10 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    iVar3 = Gia_ManAppendCi(p_00);
    uVar5 = Abc_LitNotCond(iVar3,(uint)(((*(ulong *)pObjRi >> 0x1e & 1) != 0 ^ 0xffU) & 1));
    pObjRi->Value = uVar5;
    fCompl0 = fCompl0 + 1;
  }
  Gia_ManHashStart(p_00);
  for (iBit = iFrEnd; iBit <= pCex->iFrame; iBit = iBit + 1) {
    fCompl0 = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(p);
      bVar10 = false;
      if (fCompl0 < iVar3) {
        pObjRo = Gia_ManCi(p,fCompl0);
        bVar10 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),fCompl1);
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      fCompl0 = fCompl0 + 1;
      fCompl1 = fCompl1 + 1;
    }
    fCompl0 = 0;
    while( true ) {
      bVar10 = false;
      if (fCompl0 < p->nObjs) {
        pObjRo = Gia_ManObj(p,fCompl0);
        bVar10 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar3 = Gia_ObjIsAnd(pObjRo);
      if (iVar3 != 0) {
        pGVar7 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(ulong *)pGVar7;
        uVar5 = Gia_ObjFaninC0(pObjRo);
        uVar5 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar5;
        pGVar7 = Gia_ObjFanin1(pObjRo);
        uVar2 = *(ulong *)pGVar7;
        uVar4 = Gia_ObjFaninC1(pObjRo);
        uVar4 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar4;
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)(uVar5 & uVar4) & 1) << 0x1e;
        if ((*(ulong *)pObjRo >> 0x1e & 1) == 0) {
          if ((uVar5 == 0) && (uVar4 == 0)) {
            pGVar7 = Gia_ObjFanin0(pObjRo);
            uVar5 = pGVar7->Value;
            pGVar7 = Gia_ObjFanin1(pObjRo);
            uVar5 = Gia_ManHashOr(p_00,uVar5,pGVar7->Value);
            pObjRo->Value = uVar5;
          }
          else if (uVar5 == 0) {
            pGVar7 = Gia_ObjFanin0(pObjRo);
            pObjRo->Value = pGVar7->Value;
          }
          else {
            if (uVar4 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                            ,0x1a6,
                            "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                           );
            }
            pGVar7 = Gia_ObjFanin1(pObjRo);
            pObjRo->Value = pGVar7->Value;
          }
        }
        else {
          pGVar7 = Gia_ObjFanin0(pObjRo);
          uVar5 = pGVar7->Value;
          pGVar7 = Gia_ObjFanin1(pObjRo);
          uVar5 = Gia_ManHashAnd(p_00,uVar5,pGVar7->Value);
          pObjRo->Value = uVar5;
        }
        if (pObjRo->Value == 0) {
          __assert_fail("pObj->Value > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                        ,0x1a7,
                        "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                       );
        }
      }
      fCompl0 = fCompl0 + 1;
    }
    fCompl0 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar10 = false;
      if (fCompl0 < iVar3) {
        pObjRo = Gia_ManCo(p,fCompl0);
        bVar10 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      pGVar7 = Gia_ObjFanin0(pObjRo);
      uVar2 = *(ulong *)pGVar7;
      uVar5 = Gia_ObjFaninC0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      pGVar7 = Gia_ObjFanin0(pObjRo);
      pObjRo->Value = pGVar7->Value;
      if (pObjRo->Value == 0) {
        __assert_fail("pObj->Value > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                      ,0x1ad,
                      "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                     );
      }
      fCompl0 = fCompl0 + 1;
    }
    if (iBit == pCex->iFrame) break;
    fCompl0 = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(p);
      bVar10 = false;
      if (fCompl0 < iVar3) {
        iVar3 = Gia_ManPoNum(p);
        _k = Gia_ManCo(p,iVar3 + fCompl0);
        bVar10 = false;
        if (_k != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar3 + fCompl0);
          bVar10 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar10) break;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff | (ulong)((uint)(*(ulong *)_k >> 0x1e) & 1) << 0x1e
      ;
      pObjRi->Value = _k->Value;
      fCompl0 = fCompl0 + 1;
    }
  }
  Gia_ManHashStop(p_00);
  if (fCompl1 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                  ,0x1b8,
                  "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                 );
  }
  pGVar7 = Gia_ManPo(p,pCex->iPo);
  Gia_ManAppendCo(p_00,pGVar7->Value);
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar9;
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaAllOne( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k, iBit = 0, fCompl0, fCompl1;

    // skip trough the first iFrEnd frames
    Gia_ManCleanMark0(p);
    Gia_ManForEachRo( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    for ( i = 0; i < iFrEnd; i++ )
    {
        // remember values in frame iFrBeg
        if ( i == iFrBeg )
            Gia_ManForEachRo( p, pObjRo, k )
                if ( pObjRo->fMark0 )
                    Vec_BitWriteEntry( *pvInits, k, 1 );
        // simulate other values
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( i == iFrEnd );

    // create new AIG manager
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 1;
    Gia_ManForEachPi( p, pObj, k )
        pObj->Value = 1;
    Gia_ManForEachRo( p, pObjRo, k )
        pObjRo->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), !pObjRo->fMark0 );
    Gia_ManHashStart( pNew );
    for ( i = iFrEnd; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
            assert( pObj->Value > 0 );
        } 
        if ( i == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->Value = pObjRi->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );

    // create PO
    Gia_ManAppendCo( pNew, Gia_ManPo(p, pCex->iPo)->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}